

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_delay.c
# Opt level: O0

void * sigdelwrite_new(t_symbol *s,t_floatarg msec)

{
  t_pd *x_00;
  t_pd p_Var1;
  t_sigdelwrite *x;
  t_pd p_Stack_10;
  t_floatarg msec_local;
  t_symbol *s_local;
  
  x_00 = pd_new(sigdelwrite_class);
  p_Stack_10 = (t_pd)s;
  if (*s->s_name == '\0') {
    p_Stack_10 = (t_pd)gensym("delwrite~");
  }
  pd_bind(x_00,(t_symbol *)p_Stack_10);
  x_00[6] = p_Stack_10;
  *(t_floatarg *)(x_00 + 7) = msec;
  *(undefined4 *)(x_00 + 8) = 0;
  p_Var1 = (t_pd)getbytes(0x10);
  x_00[9] = p_Var1;
  *(undefined4 *)(x_00 + 0xb) = 0;
  *(undefined4 *)(x_00 + 0xc) = 0;
  *(undefined4 *)((long)x_00 + 100) = 0;
  return x_00;
}

Assistant:

static void *sigdelwrite_new(t_symbol *s, t_floatarg msec)
{
    t_sigdelwrite *x = (t_sigdelwrite *)pd_new(sigdelwrite_class);
    if (!*s->s_name) s = gensym("delwrite~");
    pd_bind(&x->x_obj.ob_pd, s);
    x->x_sym = s;
    x->x_deltime = msec;
    x->x_cspace.c_n = 0;
    x->x_cspace.c_vec = getbytes(XTRASAMPS * sizeof(t_sample));
    x->x_sortno = 0;
    x->x_vecsize = 0;
    x->x_f = 0;
    return (x);
}